

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlFreeDoc(xmlDocPtr cur)

{
  xmlDictPtr dict;
  xmlDtdPtr cur_00;
  xmlDtdPtr cur_01;
  int iVar1;
  xmlDeregisterNodeFunc *pp_Var2;
  
  if (cur == (xmlDocPtr)0x0) {
    return;
  }
  dict = cur->dict;
  if ((__xmlRegisterCallbacks != 0) &&
     (pp_Var2 = __xmlDeregisterNodeDefaultValue(), *pp_Var2 != (xmlDeregisterNodeFunc)0x0)) {
    pp_Var2 = __xmlDeregisterNodeDefaultValue();
    (**pp_Var2)((xmlNodePtr)cur);
  }
  if ((xmlIDTablePtr)cur->ids != (xmlIDTablePtr)0x0) {
    xmlFreeIDTable((xmlIDTablePtr)cur->ids);
  }
  cur->ids = (void *)0x0;
  if ((xmlRefTablePtr)cur->refs != (xmlRefTablePtr)0x0) {
    xmlFreeRefTable((xmlRefTablePtr)cur->refs);
  }
  cur->refs = (void *)0x0;
  cur_00 = cur->intSubset;
  cur_01 = cur->extSubset;
  if (cur_01 != (xmlDtdPtr)0x0 && cur_00 != cur_01) {
    xmlUnlinkNode((xmlNodePtr)cur_01);
    cur->extSubset = (_xmlDtd *)0x0;
    xmlFreeDtd(cur_01);
  }
  if (cur_00 != (xmlDtdPtr)0x0) {
    xmlUnlinkNode((xmlNodePtr)cur->intSubset);
    cur->intSubset = (_xmlDtd *)0x0;
    xmlFreeDtd(cur_00);
  }
  if (cur->children != (xmlNodePtr)0x0) {
    xmlFreeNodeList(cur->children);
  }
  if (cur->oldNs != (xmlNsPtr)0x0) {
    xmlFreeNsList(cur->oldNs);
  }
  if ((cur->version != (xmlChar *)0x0) &&
     ((dict == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict,cur->version), iVar1 == 0)))) {
    (*xmlFree)(cur->version);
  }
  if (((xmlChar *)cur->name != (xmlChar *)0x0) &&
     ((dict == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict,(xmlChar *)cur->name), iVar1 == 0)))) {
    (*xmlFree)(cur->name);
  }
  if ((cur->encoding != (xmlChar *)0x0) &&
     ((dict == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict,cur->encoding), iVar1 == 0)))) {
    (*xmlFree)(cur->encoding);
  }
  if ((cur->URL != (xmlChar *)0x0) &&
     ((dict == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict,cur->URL), iVar1 == 0)))) {
    (*xmlFree)(cur->URL);
  }
  (*xmlFree)(cur);
  if (dict == (xmlDictPtr)0x0) {
    return;
  }
  xmlDictFree(dict);
  return;
}

Assistant:

void
xmlFreeDoc(xmlDocPtr cur) {
    xmlDtdPtr extSubset, intSubset;
    xmlDictPtr dict = NULL;

    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlFreeDoc : document == NULL\n");
#endif
	return;
    }

    if (cur != NULL) dict = cur->dict;

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr)cur);

    /*
     * Do this before freeing the children list to avoid ID lookups
     */
    if (cur->ids != NULL) xmlFreeIDTable((xmlIDTablePtr) cur->ids);
    cur->ids = NULL;
    if (cur->refs != NULL) xmlFreeRefTable((xmlRefTablePtr) cur->refs);
    cur->refs = NULL;
    extSubset = cur->extSubset;
    intSubset = cur->intSubset;
    if (intSubset == extSubset)
	extSubset = NULL;
    if (extSubset != NULL) {
	xmlUnlinkNode((xmlNodePtr) cur->extSubset);
	cur->extSubset = NULL;
	xmlFreeDtd(extSubset);
    }
    if (intSubset != NULL) {
	xmlUnlinkNode((xmlNodePtr) cur->intSubset);
	cur->intSubset = NULL;
	xmlFreeDtd(intSubset);
    }

    if (cur->children != NULL) xmlFreeNodeList(cur->children);
    if (cur->oldNs != NULL) xmlFreeNsList(cur->oldNs);

    DICT_FREE(cur->version)
    DICT_FREE(cur->name)
    DICT_FREE(cur->encoding)
    DICT_FREE(cur->URL)
    xmlFree(cur);
    if (dict) xmlDictFree(dict);
}